

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_format.cc
# Opt level: O0

char * absl::lts_20240722::time_internal::cctz::detail::anon_unknown_0::ParseSubSeconds
                 (char *dp,femtoseconds *subseconds)

{
  undefined8 local_48;
  int local_3c;
  char *pcStack_38;
  int d;
  char *cp;
  char *bp;
  int_fast64_t exp;
  int_fast64_t v;
  femtoseconds *subseconds_local;
  char *dp_local;
  
  subseconds_local = (femtoseconds *)dp;
  if (dp != (char *)0x0) {
    exp = 0;
    bp = (char *)0x0;
    cp = dp;
    v = (int_fast64_t)subseconds;
    while ((pcStack_38 = strchr((anonymous_namespace)::kDigits,(int)(char)subseconds_local->__r),
           pcStack_38 != (char *)0x0 && (local_3c = (int)pcStack_38 + -0x147584, local_3c < 10))) {
      if ((long)bp < 0xf) {
        bp = bp + 1;
        exp = (long)local_3c + exp * 10;
      }
      subseconds_local = (femtoseconds *)((long)&subseconds_local->__r + 1);
    }
    if (subseconds_local == (femtoseconds *)cp) {
      subseconds_local = (femtoseconds *)0x0;
    }
    else {
      exp = *(long *)((anonymous_namespace)::kExp10 + (0xf - (long)bp) * 8) * exp;
      std::chrono::duration<long,std::ratio<1l,1000000000000000l>>::duration<long,void>
                ((duration<long,std::ratio<1l,1000000000000000l>> *)&local_48,&exp);
      *(undefined8 *)v = local_48;
    }
  }
  return (char *)subseconds_local;
}

Assistant:

const char* ParseSubSeconds(const char* dp, detail::femtoseconds* subseconds) {
  if (dp != nullptr) {
    std::int_fast64_t v = 0;
    std::int_fast64_t exp = 0;
    const char* const bp = dp;
    while (const char* cp = strchr(kDigits, *dp)) {
      int d = static_cast<int>(cp - kDigits);
      if (d >= 10) break;
      if (exp < 15) {
        exp += 1;
        v *= 10;
        v += d;
      }
      ++dp;
    }
    if (dp != bp) {
      v *= kExp10[15 - exp];
      *subseconds = detail::femtoseconds(v);
    } else {
      dp = nullptr;
    }
  }
  return dp;
}